

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

void __thiscall
duckdb::WindowQuantileState<duckdb::interval_t>::SkipListUpdater::Right
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *this_00;
  bool bVar1;
  interval_t *piVar2;
  idx_t local_50;
  pair<unsigned_long,_duckdb::interval_t> local_48;
  
  while (begin < end) {
    local_50 = begin;
    bVar1 = QuantileIncluded<duckdb::interval_t>::operator()(this->included,&local_50);
    if (bVar1) {
      this_00 = this->skip;
      piVar2 = QuantileCursor<duckdb::interval_t>::operator[](this->data,local_50);
      local_48.first = local_50;
      local_48.second.months = piVar2->months;
      local_48.second.days = piVar2->days;
      local_48.second.micros = piVar2->micros;
      duckdb_skiplistlib::skip_list::
      HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
      ::insert(this_00,&local_48);
    }
    begin = local_50 + 1;
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.insert(SkipType(begin, data[begin]));
				}
			}
		}